

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O1

FxExpression * ParseRandom(FScanner *sc,FName *identifier,PClassActor *cls)

{
  int iVar1;
  FRandom *r;
  FxExpression *mi;
  FxExpression *ma;
  FxRandom *this;
  FScriptPosition local_40;
  
  r = ParseRNG(sc);
  FScanner::MustGetToken(sc,0x28);
  mi = ParseExpressionM(sc,cls);
  FScanner::MustGetToken(sc,0x2c);
  ma = ParseExpressionM(sc,cls);
  FScanner::MustGetToken(sc,0x29);
  iVar1 = identifier->Index;
  this = (FxRandom *)operator_new(0x50);
  if (iVar1 == 0xcc) {
    FScriptPosition::FScriptPosition(&local_40,sc);
    FxRandom::FxRandom(this,r,mi,ma,&local_40);
  }
  else {
    FScriptPosition::FScriptPosition(&local_40,sc);
    FxFRandom::FxFRandom((FxFRandom *)this,r,mi,ma,&local_40);
  }
  FString::~FString(&local_40.FileName);
  return &this->super_FxExpression;
}

Assistant:

static FxExpression *ParseRandom(FScanner &sc, FName identifier, PClassActor *cls)
{
	FRandom *rng = ParseRNG(sc);

	sc.MustGetToken('(');
	FxExpression *min = ParseExpressionM (sc, cls);
	sc.MustGetToken(',');
	FxExpression *max = ParseExpressionM (sc, cls);
	sc.MustGetToken(')');

	if (identifier == NAME_Random)
	{
		return new FxRandom(rng, min, max, sc);
	}
	else
	{
		return new FxFRandom(rng, min, max, sc);
	}
}